

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_test.cxx
# Opt level: O0

int raft_server_test::multiple_config_change_test(void)

{
  initializer_list<RaftPkg_*> __l;
  bool bVar1;
  _Setfill<char> _Var2;
  int32 iVar3;
  _Setw _Var4;
  ostream *poVar5;
  size_t sVar6;
  void *pvVar7;
  element_type *peVar8;
  reference ppRVar9;
  size_type sVar10;
  element_type *peVar11;
  int __how;
  int __how_00;
  int __how_01;
  int __how_02;
  int iVar12;
  int _v_4;
  int _ev_1;
  ptr<srv_config> s4_conf;
  ptr<cluster_config> c_conf;
  ptr<srv_config> *s_conf;
  shared_ptr<nuraft::srv_config> *entry;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *__range2;
  int _v_3;
  int _ev;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  configs_out;
  RaftPkg *pp;
  iterator __end1;
  iterator __begin1;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *__range1;
  int _v_2;
  cmd_result_code _gt;
  cmd_result_code _sm;
  ptr<raft_result> ret;
  int _v_1;
  int _v;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> pkgs;
  RaftPkg s4;
  RaftPkg s3;
  RaftPkg s2;
  RaftPkg s1;
  string s4_addr;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  ptr<FakeNetworkBase> f_base;
  TestMgr *in_stack_ffffffffffffede8;
  RaftPkg *in_stack_ffffffffffffedf0;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
  *in_stack_ffffffffffffedf8;
  ostream *in_stack_ffffffffffffee00;
  raft_server *in_stack_ffffffffffffee08;
  allocator_type *in_stack_ffffffffffffee18;
  ostream *in_stack_ffffffffffffee20;
  cluster_config *in_stack_ffffffffffffee28;
  size_type in_stack_ffffffffffffee30;
  ostream *in_stack_ffffffffffffee38;
  raft_server *in_stack_ffffffffffffee40;
  size_t in_stack_ffffffffffffee50;
  string *in_stack_ffffffffffffee58;
  undefined8 in_stack_ffffffffffffee60;
  ptr<FakeNetworkBase> *in_stack_ffffffffffffee68;
  RaftPkg *in_stack_ffffffffffffee70;
  string *in_stack_ffffffffffffeea0;
  FakeNetwork *in_stack_ffffffffffffeea8;
  int in_stack_ffffffffffffeec4;
  raft_server *in_stack_ffffffffffffeec8;
  undefined8 in_stack_ffffffffffffefb8;
  undefined1 restart;
  raft_params *in_stack_ffffffffffffefc0;
  raft_server *in_stack_ffffffffffffefc8;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *in_stack_fffffffffffff4a8;
  string local_900 [32];
  int32 local_8e0;
  int local_8dc;
  native_handle_type local_8b8;
  char local_8ad;
  int local_8ac;
  string local_8a8 [32];
  reference local_888;
  reference local_880;
  shared_ptr<nuraft::srv_config> *local_878;
  __normal_iterator<std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
  local_870;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *local_868;
  native_handle_type local_860;
  char local_855;
  int local_854;
  string local_850 [32];
  int local_830;
  int local_82c;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  local_828;
  RaftPkg *local_800;
  RaftPkg **local_7f8;
  __normal_iterator<RaftPkg_**,_std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>_> local_7f0;
  undefined1 *local_7e8;
  native_handle_type local_7e0;
  char local_7d5;
  int local_7d4;
  string local_7d0 [36];
  int local_7ac;
  string local_7a8 [32];
  string local_788 [32];
  string local_768 [32];
  string local_748 [48];
  native_handle_type local_718;
  char local_70d;
  int local_70c;
  string local_708 [32];
  int local_6e8;
  cmd_result_code local_6e4;
  native_handle_type local_6a0;
  char local_695;
  int local_694;
  string local_690 [32];
  int local_670;
  uint local_66c;
  native_handle_type local_668;
  char local_65d;
  int local_65c;
  string local_658 [32];
  int local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  undefined1 **local_610;
  undefined8 local_608;
  undefined1 local_600 [24];
  undefined1 local_5e8 [328];
  undefined1 local_4a0 [328];
  undefined1 local_358 [328];
  undefined1 local_210 [335];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [52];
  int local_4;
  
  restart = (undefined1)((ulong)in_stack_ffffffffffffefb8 >> 0x38);
  iVar12 = (int)((ulong)in_stack_ffffffffffffee60 >> 0x20);
  raft_functional_common::reset_log_files();
  nuraft::cs_new<nuraft::FakeNetworkBase>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"S1",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"S2",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"S3",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"S4",&local_c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  RaftPkg::RaftPkg(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,iVar12,
                   in_stack_ffffffffffffee58);
  RaftPkg::RaftPkg(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,iVar12,
                   in_stack_ffffffffffffee58);
  RaftPkg::RaftPkg(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,iVar12,
                   in_stack_ffffffffffffee58);
  RaftPkg::RaftPkg(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,iVar12,
                   in_stack_ffffffffffffee58);
  local_630 = local_210;
  local_628 = local_358;
  local_620 = local_4a0;
  local_618 = local_5e8;
  local_610 = &local_630;
  local_608 = 4;
  std::allocator<RaftPkg_*>::allocator((allocator<RaftPkg_*> *)0x12948a);
  __l._M_len = in_stack_ffffffffffffee30;
  __l._M_array = (iterator)in_stack_ffffffffffffee28;
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::vector
            ((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)in_stack_ffffffffffffee20,__l,
             in_stack_ffffffffffffee18);
  std::allocator<RaftPkg_*>::~allocator((allocator<RaftPkg_*> *)0x1294be);
  local_638 = launch_servers((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)
                             in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,(bool)restart);
  if (local_638 == 0) {
    local_670 = make_group(in_stack_fffffffffffff4a8);
    if (local_670 == 0) {
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12a01e);
      RaftPkg::getTestMgr((RaftPkg *)0x12a033);
      raft_functional_common::TestMgr::get_srv_config(in_stack_ffffffffffffede8);
      peVar8 = std::
               __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x12a061);
      nuraft::srv_config::get_id(peVar8);
      nuraft::raft_server::remove_srv(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec4);
      std::
      shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
      ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                     *)0x12a09d);
      std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x12a0aa);
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12a0b7);
      RaftPkg::getTestMgr((RaftPkg *)0x12a0cc);
      raft_functional_common::TestMgr::get_srv_config(in_stack_ffffffffffffede8);
      peVar8 = std::
               __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x12a0fa);
      nuraft::srv_config::get_id(peVar8);
      nuraft::raft_server::remove_srv(in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec4);
      std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x12a136);
      std::
      __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x12a143);
      local_6e4 = nuraft::
                  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
                  get_result_code(in_stack_ffffffffffffedf8);
      local_6e8 = 0;
      if (local_6e4 < OK) {
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x12a760);
        RaftPkg::getTestMgr((RaftPkg *)0x12a775);
        raft_functional_common::TestMgr::get_srv_config(in_stack_ffffffffffffede8);
        peVar8 = std::
                 __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x12a7a3);
        nuraft::srv_config::get_id(peVar8);
        nuraft::raft_server::set_priority
                  (in_stack_ffffffffffffefc8,(int)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
                   (int)in_stack_ffffffffffffefc0);
        std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x12a7dc)
        ;
        std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x12a7e9);
        std::__cxx11::string::string(local_748);
        nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
        std::__cxx11::string::~string(local_748);
        std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x12a837);
        std::__cxx11::string::string(local_768);
        nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
        std::__cxx11::string::~string(local_768);
        std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x12a885);
        std::__cxx11::string::string(local_788);
        nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
        std::__cxx11::string::~string(local_788);
        std::__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x12a8d3);
        std::__cxx11::string::string(local_7a8);
        nuraft::FakeNetwork::execReqResp(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
        std::__cxx11::string::~string(local_7a8);
        local_7ac = wait_for_sm_exec((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)
                                     in_stack_ffffffffffffee58,in_stack_ffffffffffffee50);
        if (local_7ac == 0) {
          local_7e8 = local_600;
          local_7f0._M_current =
               (RaftPkg **)
               std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::begin
                         ((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)in_stack_ffffffffffffede8
                         );
          local_7f8 = (RaftPkg **)
                      std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::end
                                ((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)
                                 in_stack_ffffffffffffede8);
          while( true ) {
            iVar12 = (int)&local_7f8;
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<RaftPkg_**,_std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>_>
                                *)in_stack_ffffffffffffedf0,
                               (__normal_iterator<RaftPkg_**,_std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>_>
                                *)in_stack_ffffffffffffede8);
            if (!bVar1) break;
            ppRVar9 = __gnu_cxx::
                      __normal_iterator<RaftPkg_**,_std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>_>
                      ::operator*(&local_7f0);
            local_800 = *ppRVar9;
            RaftPkg::getTestMgr((RaftPkg *)0x12af60);
            raft_functional_common::TestMgr::get_srv_config(in_stack_ffffffffffffede8);
            peVar8 = std::
                     __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x12af8e);
            iVar3 = nuraft::srv_config::get_id(peVar8);
            std::shared_ptr<nuraft::srv_config>::~shared_ptr
                      ((shared_ptr<nuraft::srv_config> *)0x12afac);
            if (iVar3 != 3) {
              std::
              vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              ::vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                        *)0x12aff8);
              std::
              __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x12b00c);
              nuraft::raft_server::get_srv_config_all
                        (in_stack_ffffffffffffee40,
                         (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                          *)in_stack_ffffffffffffee38);
              local_82c = 3;
              sVar10 = std::
                       vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       ::size(&local_828);
              local_830 = (int)sVar10;
              if (local_82c == local_830) {
                local_868 = &local_828;
                local_870._M_current =
                     (shared_ptr<nuraft::srv_config> *)
                     std::
                     vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                     ::begin((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                              *)in_stack_ffffffffffffede8);
                local_878 = (shared_ptr<nuraft::srv_config> *)
                            std::
                            vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                            ::end((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                                   *)in_stack_ffffffffffffede8);
                while (bVar1 = __gnu_cxx::operator!=
                                         ((__normal_iterator<std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
                                           *)in_stack_ffffffffffffedf0,
                                          (__normal_iterator<std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
                                           *)in_stack_ffffffffffffede8), bVar1) {
                  local_888 = __gnu_cxx::
                              __normal_iterator<std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
                              ::operator*(&local_870);
                  local_880 = local_888;
                  peVar8 = std::
                           __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x12b5cb);
                  iVar3 = nuraft::srv_config::get_id(peVar8);
                  if (iVar3 != 1) {
                    peVar8 = std::
                             __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x12b5f9);
                    iVar3 = nuraft::srv_config::get_id(peVar8);
                    if (iVar3 != 2) {
                      peVar8 = std::
                               __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)0x12b627);
                      iVar3 = nuraft::srv_config::get_id(peVar8);
                      if (iVar3 != 4) {
                        poVar5 = (ostream *)
                                 std::ostream::operator<<
                                           (&std::cout,std::endl<char,std::char_traits<char>>);
                        poVar5 = std::operator<<(poVar5,"        time: ");
                        poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
                        TestSuite::getTimeString_abi_cxx11_();
                        poVar5 = std::operator<<(poVar5,local_8a8);
                        poVar5 = std::operator<<(poVar5,"\x1b[0m");
                        poVar5 = std::operator<<(poVar5,"\n");
                        poVar5 = std::operator<<(poVar5,"      thread: ");
                        poVar5 = std::operator<<(poVar5,"\x1b[33m");
                        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
                        local_8ac = (int)std::setw(4);
                        poVar5 = std::operator<<(poVar5,(_Setw)local_8ac);
                        local_8ad = (char)std::setfill<char>('0');
                        poVar5 = std::operator<<(poVar5,local_8ad);
                        local_8b8 = (native_handle_type)std::this_thread::get_id();
                        sVar6 = std::hash<std::thread::id>::operator()
                                          ((hash<std::thread::id> *)in_stack_ffffffffffffedf0,
                                           (id *)in_stack_ffffffffffffede8);
                        pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
                        poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
                        poVar5 = std::operator<<(poVar5,"\x1b[0m");
                        poVar5 = std::operator<<(poVar5,"\n");
                        poVar5 = std::operator<<(poVar5,"          in: ");
                        poVar5 = std::operator<<(poVar5,"\x1b[36m");
                        poVar5 = std::operator<<(poVar5,"multiple_config_change_test");
                        poVar5 = std::operator<<(poVar5,"()\x1b[0m");
                        poVar5 = std::operator<<(poVar5,"\n");
                        poVar5 = std::operator<<(poVar5,"          at: ");
                        poVar5 = std::operator<<(poVar5,"\x1b[32m");
                        poVar5 = std::operator<<(poVar5,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                                );
                        poVar5 = std::operator<<(poVar5,"\x1b[0m:");
                        poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
                        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x321);
                        poVar5 = std::operator<<(poVar5,"\x1b[0m");
                        poVar5 = std::operator<<(poVar5,"\n");
                        poVar5 = std::operator<<(poVar5,
                                                 "    value of: \x1b[1;34ms_conf->get_id() == 1 || s_conf->get_id() == 2 || s_conf->get_id() == 4\x1b[0m\n"
                                                );
                        poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
                        poVar5 = std::operator<<(poVar5,"true");
                        poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
                        poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
                        poVar5 = std::operator<<(poVar5,"false");
                        std::operator<<(poVar5,"\x1b[0m\n");
                        std::__cxx11::string::~string(local_8a8);
                        TestSuite::failHandler();
                        local_4 = -1;
                        local_66c = 1;
                        goto LAB_0012c093;
                      }
                    }
                  }
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<nuraft::srv_config>_*,_std::vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>_>
                  ::operator++(&local_870);
                }
                std::
                __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x12bb47);
                nuraft::raft_server::get_config(in_stack_ffffffffffffee08);
                std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x12bb66);
                nuraft::cluster_config::get_server
                          (in_stack_ffffffffffffee28,(int)((ulong)in_stack_ffffffffffffee20 >> 0x20)
                          );
                local_8dc = 10;
                peVar8 = std::
                         __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x12bb95);
                local_8e0 = nuraft::srv_config::get_priority(peVar8);
                bVar1 = local_8dc != local_8e0;
                if (bVar1) {
                  poVar5 = (ostream *)
                           std::ostream::operator<<
                                     (&std::cout,std::endl<char,std::char_traits<char>>);
                  poVar5 = std::operator<<(poVar5,"        time: ");
                  poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
                  TestSuite::getTimeString_abi_cxx11_();
                  poVar5 = std::operator<<(poVar5,local_900);
                  poVar5 = std::operator<<(poVar5,"\x1b[0m");
                  poVar5 = std::operator<<(poVar5,"\n");
                  poVar5 = std::operator<<(poVar5,"      thread: ");
                  poVar5 = std::operator<<(poVar5,"\x1b[33m");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
                  _Var4 = std::setw(4);
                  poVar5 = std::operator<<(poVar5,_Var4);
                  _Var2 = std::setfill<char>('0');
                  poVar5 = std::operator<<(poVar5,_Var2._M_c);
                  std::this_thread::get_id();
                  sVar6 = std::hash<std::thread::id>::operator()
                                    ((hash<std::thread::id> *)in_stack_ffffffffffffedf0,
                                     (id *)in_stack_ffffffffffffede8);
                  pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
                  poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
                  poVar5 = std::operator<<(poVar5,"\x1b[0m");
                  poVar5 = std::operator<<(poVar5,"\n");
                  poVar5 = std::operator<<(poVar5,"          in: ");
                  poVar5 = std::operator<<(poVar5,"\x1b[36m");
                  poVar5 = std::operator<<(poVar5,"multiple_config_change_test");
                  poVar5 = std::operator<<(poVar5,"()\x1b[0m");
                  poVar5 = std::operator<<(poVar5,"\n");
                  poVar5 = std::operator<<(poVar5,"          at: ");
                  poVar5 = std::operator<<(poVar5,"\x1b[32m");
                  poVar5 = std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                          );
                  in_stack_ffffffffffffee40 = (raft_server *)std::operator<<(poVar5,"\x1b[0m:");
                  in_stack_ffffffffffffee38 =
                       std::operator<<((ostream *)in_stack_ffffffffffffee40,"\x1b[1;35m");
                  poVar5 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffee38,0x327);
                  in_stack_ffffffffffffee28 = (cluster_config *)std::operator<<(poVar5,"\x1b[0m");
                  in_stack_ffffffffffffee20 =
                       std::operator<<((ostream *)in_stack_ffffffffffffee28,"\n");
                  poVar5 = std::operator<<(in_stack_ffffffffffffee20,
                                           "    value of: \x1b[1;34ms4_conf->get_priority()\x1b[0m\n"
                                          );
                  poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
                  in_stack_ffffffffffffee08 =
                       (raft_server *)std::ostream::operator<<(poVar5,local_8dc);
                  in_stack_ffffffffffffee00 =
                       std::operator<<((ostream *)in_stack_ffffffffffffee08,"\x1b[0m\n");
                  poVar5 = std::operator<<(in_stack_ffffffffffffee00,"      actual: \x1b[1;31m");
                  in_stack_ffffffffffffedf0 = (RaftPkg *)std::ostream::operator<<(poVar5,local_8e0);
                  std::operator<<((ostream *)in_stack_ffffffffffffedf0,"\x1b[0m\n");
                  std::__cxx11::string::~string(local_900);
                  TestSuite::failHandler();
                  local_4 = -1;
                }
                local_66c = (uint)bVar1;
                std::shared_ptr<nuraft::srv_config>::~shared_ptr
                          ((shared_ptr<nuraft::srv_config> *)0x12c086);
                std::shared_ptr<nuraft::cluster_config>::~shared_ptr
                          ((shared_ptr<nuraft::cluster_config> *)0x12c093);
              }
              else {
                poVar5 = (ostream *)
                         std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>)
                ;
                poVar5 = std::operator<<(poVar5,"        time: ");
                poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
                TestSuite::getTimeString_abi_cxx11_();
                poVar5 = std::operator<<(poVar5,local_850);
                poVar5 = std::operator<<(poVar5,"\x1b[0m");
                poVar5 = std::operator<<(poVar5,"\n");
                poVar5 = std::operator<<(poVar5,"      thread: ");
                poVar5 = std::operator<<(poVar5,"\x1b[33m");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
                local_854 = (int)std::setw(4);
                poVar5 = std::operator<<(poVar5,(_Setw)local_854);
                local_855 = (char)std::setfill<char>('0');
                poVar5 = std::operator<<(poVar5,local_855);
                local_860 = (native_handle_type)std::this_thread::get_id();
                sVar6 = std::hash<std::thread::id>::operator()
                                  ((hash<std::thread::id> *)in_stack_ffffffffffffedf0,
                                   (id *)in_stack_ffffffffffffede8);
                pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
                poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
                poVar5 = std::operator<<(poVar5,"\x1b[0m");
                poVar5 = std::operator<<(poVar5,"\n");
                poVar5 = std::operator<<(poVar5,"          in: ");
                poVar5 = std::operator<<(poVar5,"\x1b[36m");
                poVar5 = std::operator<<(poVar5,"multiple_config_change_test");
                poVar5 = std::operator<<(poVar5,"()\x1b[0m");
                poVar5 = std::operator<<(poVar5,"\n");
                poVar5 = std::operator<<(poVar5,"          at: ");
                poVar5 = std::operator<<(poVar5,"\x1b[32m");
                poVar5 = std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                        );
                poVar5 = std::operator<<(poVar5,"\x1b[0m:");
                poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x31c);
                poVar5 = std::operator<<(poVar5,"\x1b[0m");
                poVar5 = std::operator<<(poVar5,"\n");
                poVar5 = std::operator<<(poVar5,
                                         "    value of: \x1b[1;34mconfigs_out.size()\x1b[0m\n");
                poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_82c);
                poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
                poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_830);
                std::operator<<(poVar5,"\x1b[0m\n");
                std::__cxx11::string::~string(local_850);
                TestSuite::failHandler();
                local_4 = -1;
                local_66c = 1;
              }
LAB_0012c093:
              std::
              vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                         *)in_stack_ffffffffffffee00);
              if (local_66c != 0) goto LAB_0012c189;
            }
            __gnu_cxx::
            __normal_iterator<RaftPkg_**,_std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>_>::
            operator++(&local_7f0);
          }
          print_stats((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)in_stack_ffffffffffffee40);
          peVar11 = std::
                    __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x12c10d);
          nuraft::raft_server::shutdown(peVar11,iVar12,__how);
          peVar11 = std::
                    __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x12c124);
          nuraft::raft_server::shutdown(peVar11,iVar12,__how_00);
          peVar11 = std::
                    __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x12c13b);
          nuraft::raft_server::shutdown(peVar11,iVar12,__how_01);
          peVar11 = std::
                    __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x12c152);
          nuraft::raft_server::shutdown(peVar11,iVar12,__how_02);
          std::
          __shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x12c169);
          nuraft::FakeNetworkBase::destroy((FakeNetworkBase *)in_stack_ffffffffffffedf0);
          local_4 = 0;
          local_66c = 1;
        }
        else {
          poVar5 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"        time: ");
          poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar5 = std::operator<<(poVar5,local_7d0);
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"      thread: ");
          poVar5 = std::operator<<(poVar5,"\x1b[33m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
          local_7d4 = (int)std::setw(4);
          poVar5 = std::operator<<(poVar5,(_Setw)local_7d4);
          local_7d5 = (char)std::setfill<char>('0');
          poVar5 = std::operator<<(poVar5,local_7d5);
          local_7e0 = (native_handle_type)std::this_thread::get_id();
          sVar6 = std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)in_stack_ffffffffffffedf0,
                             (id *)in_stack_ffffffffffffede8);
          pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
          poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"          in: ");
          poVar5 = std::operator<<(poVar5,"\x1b[36m");
          poVar5 = std::operator<<(poVar5,"multiple_config_change_test");
          poVar5 = std::operator<<(poVar5,"()\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"          at: ");
          poVar5 = std::operator<<(poVar5,"\x1b[32m");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                  );
          poVar5 = std::operator<<(poVar5,"\x1b[0m:");
          poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x312);
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,
                                   "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n"
                                  );
          poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
          poVar5 = std::operator<<(poVar5,"0");
          poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
          poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_7ac);
          std::operator<<(poVar5,"\x1b[0m\n");
          std::__cxx11::string::~string(local_7d0);
          TestSuite::failHandler();
          local_4 = -1;
          local_66c = 1;
        }
      }
      else {
        poVar5 = (ostream *)
                 std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"        time: ");
        poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,local_708);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"      thread: ");
        poVar5 = std::operator<<(poVar5,"\x1b[33m");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
        local_70c = (int)std::setw(4);
        poVar5 = std::operator<<(poVar5,(_Setw)local_70c);
        local_70d = (char)std::setfill<char>('0');
        poVar5 = std::operator<<(poVar5,local_70d);
        local_718 = (native_handle_type)std::this_thread::get_id();
        sVar6 = std::hash<std::thread::id>::operator()
                          ((hash<std::thread::id> *)in_stack_ffffffffffffedf0,
                           (id *)in_stack_ffffffffffffede8);
        pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
        poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"          in: ");
        poVar5 = std::operator<<(poVar5,"\x1b[36m");
        poVar5 = std::operator<<(poVar5,"multiple_config_change_test");
        poVar5 = std::operator<<(poVar5,"()\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"          at: ");
        poVar5 = std::operator<<(poVar5,"\x1b[32m");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                );
        poVar5 = std::operator<<(poVar5,"\x1b[0m:");
        poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x304);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"    expected: ");
        poVar5 = std::operator<<(poVar5,"\x1b[1;34m0 > ret->get_result_code()\x1b[0m\n");
        poVar5 = std::operator<<(poVar5,"    value of ");
        poVar5 = std::operator<<(poVar5,"\x1b[1;32m0\x1b[0m: ");
        poVar5 = std::operator<<(poVar5,"\x1b[1;31m");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_6e8);
        poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
        poVar5 = std::operator<<(poVar5,"    value of ");
        poVar5 = std::operator<<(poVar5,"\x1b[1;32mret->get_result_code()\x1b[0m: ");
        poVar5 = std::operator<<(poVar5,"\x1b[1;31m");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_6e4);
        std::operator<<(poVar5,"\x1b[0m\n");
        std::__cxx11::string::~string(local_708);
        TestSuite::failHandler();
        local_4 = -1;
        local_66c = 1;
      }
LAB_0012c189:
      std::
      shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
      ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                     *)0x12c196);
    }
    else {
      poVar5 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"        time: ");
      poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_690);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"      thread: ");
      poVar5 = std::operator<<(poVar5,"\x1b[33m");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
      local_694 = (int)std::setw(4);
      poVar5 = std::operator<<(poVar5,(_Setw)local_694);
      local_695 = (char)std::setfill<char>('0');
      poVar5 = std::operator<<(poVar5,local_695);
      local_6a0 = (native_handle_type)std::this_thread::get_id();
      sVar6 = std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)in_stack_ffffffffffffedf0,
                         (id *)in_stack_ffffffffffffede8);
      pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
      poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          in: ");
      poVar5 = std::operator<<(poVar5,"\x1b[36m");
      poVar5 = std::operator<<(poVar5,"multiple_config_change_test");
      poVar5 = std::operator<<(poVar5,"()\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          at: ");
      poVar5 = std::operator<<(poVar5,"\x1b[32m");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar5 = std::operator<<(poVar5,"\x1b[0m:");
      poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2fc);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mmake_group( pkgs )\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
      poVar5 = std::operator<<(poVar5,"0");
      poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_670);
      std::operator<<(poVar5,"\x1b[0m\n");
      std::__cxx11::string::~string(local_690);
      TestSuite::failHandler();
      local_4 = -1;
      local_66c = 1;
    }
  }
  else {
    poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,local_658);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
    local_65c = (int)std::setw(4);
    poVar5 = std::operator<<(poVar5,(_Setw)local_65c);
    local_65d = (char)std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,local_65d);
    local_668 = (native_handle_type)std::this_thread::get_id();
    sVar6 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_ffffffffffffedf0,
                       (id *)in_stack_ffffffffffffede8);
    pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar6 & 0xffff);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"multiple_config_change_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2fb);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mlaunch_servers( pkgs )\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
    poVar5 = std::operator<<(poVar5,"0");
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_638);
    std::operator<<(poVar5,"\x1b[0m\n");
    std::__cxx11::string::~string(local_658);
    TestSuite::failHandler();
    local_4 = -1;
    local_66c = 1;
  }
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::~vector
            ((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)in_stack_ffffffffffffee00);
  RaftPkg::~RaftPkg(in_stack_ffffffffffffedf0);
  RaftPkg::~RaftPkg(in_stack_ffffffffffffedf0);
  RaftPkg::~RaftPkg(in_stack_ffffffffffffedf0);
  RaftPkg::~RaftPkg(in_stack_ffffffffffffedf0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  std::shared_ptr<nuraft::FakeNetworkBase>::~shared_ptr
            ((shared_ptr<nuraft::FakeNetworkBase> *)0x12c22c);
  return local_4;
}

Assistant:

int multiple_config_change_test() {
    reset_log_files();
    ptr<FakeNetworkBase> f_base = cs_new<FakeNetworkBase>();

    std::string s1_addr = "S1";
    std::string s2_addr = "S2";
    std::string s3_addr = "S3";
    std::string s4_addr = "S4";

    RaftPkg s1(f_base, 1, s1_addr);
    RaftPkg s2(f_base, 2, s2_addr);
    RaftPkg s3(f_base, 3, s3_addr);
    RaftPkg s4(f_base, 4, s4_addr);
    std::vector<RaftPkg*> pkgs = {&s1, &s2, &s3, &s4};

    CHK_Z( launch_servers( pkgs ) );
    CHK_Z( make_group( pkgs ) );

    // Remove two nodes without waiting commit.
    s1.raftServer->remove_srv( s3.getTestMgr()->get_srv_config()->get_id() );

    // Cannot remove multiple servers at once, should return error.
    ptr<raft_result> ret =
        s1.raftServer->remove_srv( s4.getTestMgr()->get_srv_config()->get_id() );
    CHK_GT(0, ret->get_result_code());

    // Priority change is OK.
    s1.raftServer->set_priority(s4.getTestMgr()->get_srv_config()->get_id(), 10);

    // Leave req/resp.
    s1.fNet->execReqResp();
    // Leave done, notify to peers.
    s1.fNet->execReqResp();
    // Probably one more.
    s1.fNet->execReqResp();
    // Notify new commit.
    s1.fNet->execReqResp();
    // Wait for bg commit for configuration change.
    CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

    // S3 should be removed.
    for (RaftPkg* pp: pkgs) {
        if (pp->getTestMgr()->get_srv_config()->get_id() == 3) continue;

        std::vector< ptr< srv_config > > configs_out;
        pp->raftServer->get_srv_config_all(configs_out);

        // Only S1, S2, and S4 should exist.
        CHK_EQ(3, configs_out.size());
        for (auto& entry: configs_out) {
            ptr<srv_config>& s_conf = entry;
            CHK_TRUE( s_conf->get_id() == 1 ||
                      s_conf->get_id() == 2 ||
                      s_conf->get_id() == 4 );
        }

        // S4's priority should be 10.
        ptr<cluster_config> c_conf = pp->raftServer->get_config();
        ptr<srv_config> s4_conf = c_conf->get_server(4);
        CHK_EQ(10, s4_conf->get_priority());
    }

    print_stats(pkgs);

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    s4.raftServer->shutdown();

    f_base->destroy();

    return 0;
}